

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

bool __thiscall irr::gui::CGUIListBox::OnEvent(CGUIListBox *this,SEvent *event)

{
  wchar_t wVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  u32 uVar5;
  u32 uVar6;
  int iVar7;
  ulong uVar8;
  wchar_t *pwVar9;
  int *in_RSI;
  long *in_RDI;
  vector2d<int> p;
  SEvent e_3;
  SEvent e_2;
  s32 current;
  s32 start;
  u32 now;
  SEvent e_1;
  SEvent e;
  s32 oldSelected;
  undefined4 in_stack_fffffffffffffde8;
  u32 in_stack_fffffffffffffdec;
  array<irr::gui::CGUIListBox::ListItem> *in_stack_fffffffffffffdf0;
  long *plVar10;
  SEvent *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  string<wchar_t> *in_stack_fffffffffffffe08;
  string<wchar_t> *in_stack_fffffffffffffe10;
  string<wchar_t> *other;
  uint in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  CGUIListBox *in_stack_fffffffffffffe20;
  long *in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe30;
  u32 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined1 onlyHover;
  uint in_stack_fffffffffffffe3c;
  CGUIListBox *in_stack_fffffffffffffe40;
  bool local_1a5;
  vector2d<int> local_178;
  undefined4 local_170 [4];
  undefined8 local_160;
  undefined4 local_158;
  undefined4 local_118 [4];
  undefined8 local_108;
  undefined4 local_100;
  int local_c0;
  byte local_b9;
  int local_98;
  u32 local_94;
  undefined4 local_90 [4];
  undefined8 local_80;
  undefined4 local_78;
  undefined4 local_58 [4];
  undefined8 local_48;
  undefined4 local_40;
  int local_1c;
  int *local_18;
  
  local_18 = in_RSI;
  uVar8 = (**(code **)(*in_RDI + 0x90))();
  if ((uVar8 & 1) != 0) {
    iVar4 = *local_18;
    if (iVar4 == 0) {
      in_stack_fffffffffffffe04 = local_18[6];
      if (in_stack_fffffffffffffe04 == 0) {
        if (*(long **)(local_18 + 2) == in_RDI) {
          *(undefined1 *)(in_RDI + 0x36) = 0;
        }
      }
      else if ((in_stack_fffffffffffffe04 == 6) && (*(long *)(local_18 + 2) == in_RDI[0x30])) {
        return true;
      }
    }
    else if (iVar4 == 1) {
      core::vector2d<int>::vector2d(&local_178,local_18[2],local_18[3]);
      onlyHover = (undefined1)((uint)in_stack_fffffffffffffe38 >> 0x18);
      in_stack_fffffffffffffdf8 = (SEvent *)(ulong)(uint)local_18[7];
      switch(in_stack_fffffffffffffdf8) {
      case (SEvent *)0x0:
        *(undefined1 *)(in_RDI + 0x36) = 1;
        return true;
      case (SEvent *)0x3:
        *(undefined1 *)(in_RDI + 0x36) = 0;
        uVar8 = (**(code **)(*in_RDI + 0x28))(in_RDI,&local_178);
        if ((uVar8 & 1) != 0) {
          selectNew(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,(bool)onlyHover);
        }
        return true;
      case (SEvent *)0x6:
        if ((((*(byte *)(in_RDI + 0x36) & 1) != 0) || ((*(byte *)((long)in_RDI + 0x1b2) & 1) != 0))
           && (uVar8 = (**(code **)(*in_RDI + 0x28))(in_RDI,&local_178), (uVar8 & 1) != 0)) {
          selectNew(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,(bool)onlyHover);
          return true;
        }
        break;
      case (SEvent *)0x7:
        plVar10 = (long *)in_RDI[0x30];
        iVar4 = (**(code **)(*(long *)in_RDI[0x30] + 0x160))();
        iVar7 = 1;
        if ((float)local_18[4] < 0.0) {
          iVar7 = -1;
        }
        iVar7 = iVar7 * -*(int *)((long)in_RDI + 0x15c);
        (**(code **)(*plVar10 + 0x168))(plVar10,iVar4 + iVar7 / 2,(long)iVar7 % 2 & 0xffffffff);
        return true;
      }
    }
    else if (iVar4 == 2) {
      if (((*(byte *)(local_18 + 5) & 1) != 0) &&
         ((((local_18[3] == 0x28 || (local_18[3] == 0x26)) ||
           ((local_18[3] == 0x24 || ((local_18[3] == 0x23 || (local_18[3] == 0x22)))))) ||
          (local_18[3] == 0x21)))) {
        local_1c = (int)in_RDI[0x2b];
        switch(local_18[3]) {
        case 0x21:
          iVar4 = core::rect<int>::getHeight((rect<int> *)(in_RDI + 8));
          *(int *)(in_RDI + 0x2b) = (int)in_RDI[0x2b] - iVar4 / *(int *)((long)in_RDI + 0x15c);
          break;
        case 0x22:
          iVar4 = core::rect<int>::getHeight((rect<int> *)(in_RDI + 8));
          *(int *)(in_RDI + 0x2b) = iVar4 / *(int *)((long)in_RDI + 0x15c) + (int)in_RDI[0x2b];
          break;
        case 0x23:
          uVar5 = core::array<irr::gui::CGUIListBox::ListItem>::size
                            ((array<irr::gui::CGUIListBox::ListItem> *)0x3c1636);
          *(u32 *)(in_RDI + 0x2b) = uVar5 - 1;
          break;
        case 0x24:
          *(undefined4 *)(in_RDI + 0x2b) = 0;
          break;
        default:
          break;
        case 0x26:
          *(int *)(in_RDI + 0x2b) = (int)in_RDI[0x2b] + -1;
          break;
        case 0x28:
          *(int *)(in_RDI + 0x2b) = (int)in_RDI[0x2b] + 1;
        }
        if ((int)in_RDI[0x2b] < 0) {
          *(undefined4 *)(in_RDI + 0x2b) = 0;
        }
        lVar2 = in_RDI[0x2b];
        uVar5 = core::array<irr::gui::CGUIListBox::ListItem>::size
                          ((array<irr::gui::CGUIListBox::ListItem> *)0x3c1703);
        if ((int)uVar5 <= (int)lVar2) {
          uVar5 = core::array<irr::gui::CGUIListBox::ListItem>::size
                            ((array<irr::gui::CGUIListBox::ListItem> *)0x3c1724);
          *(u32 *)(in_RDI + 0x2b) = uVar5 - 1;
        }
        recalculateScrollPos(in_stack_fffffffffffffe20);
        if ((((local_1c != (int)in_RDI[0x2b]) && (in_RDI[4] != 0)) &&
            ((*(byte *)(in_RDI + 0x36) & 1) == 0)) && ((*(byte *)((long)in_RDI + 0x1b2) & 1) == 0))
        {
          local_58[0] = 0;
          local_48 = 0;
          local_40 = 9;
          (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],local_58);
        }
        return true;
      }
      if (((*(byte *)(local_18 + 5) & 1) == 0) && ((local_18[3] == 0xd || (local_18[3] == 0x20)))) {
        if (in_RDI[4] != 0) {
          local_90[0] = 0;
          local_80 = 0;
          local_78 = 10;
          (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],local_90);
        }
        return true;
      }
      if (local_18[3] == 9) {
        return false;
      }
      if (((*(byte *)(local_18 + 5) & 1) != 0) && (local_18[2] != 0)) {
        local_94 = os::Timer::getTime();
        if (local_94 - *(int *)((long)in_RDI + 0x18c) < 500) {
          uVar5 = core::string<wchar_t>::size((string<wchar_t> *)0x3c18ec);
          if ((uVar5 != 1) ||
             (pwVar9 = core::string<wchar_t>::operator[]
                                 ((string<wchar_t> *)in_stack_fffffffffffffdf0,
                                  in_stack_fffffffffffffdec), *pwVar9 != local_18[2])) {
            core::string<wchar_t>::operator+=
                      ((string<wchar_t> *)in_stack_fffffffffffffdf0,
                       (wchar_t *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
            wVar1 = local_18[2];
            core::string<wchar_t>::size((string<wchar_t> *)0x3c1965);
            pwVar9 = core::string<wchar_t>::operator[]
                               ((string<wchar_t> *)in_stack_fffffffffffffdf0,
                                in_stack_fffffffffffffdec);
            *pwVar9 = wVar1;
          }
        }
        else {
          core::string<wchar_t>::operator=
                    (in_stack_fffffffffffffe08,
                     (wchar_t *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          wVar1 = local_18[2];
          pwVar9 = core::string<wchar_t>::operator[]
                             ((string<wchar_t> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec
                             );
          *pwVar9 = wVar1;
        }
        *(u32 *)((long)in_RDI + 0x18c) = local_94;
        local_98 = (int)in_RDI[0x2b];
        local_c0 = local_98;
        if ((-1 < (int)in_RDI[0x2b]) &&
           (uVar5 = core::string<wchar_t>::size((string<wchar_t> *)0x3c1a08), local_c0 = local_98,
           1 < uVar5)) {
          core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                    (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
          uVar5 = core::string<wchar_t>::size((string<wchar_t> *)0x3c1a36);
          uVar6 = core::string<wchar_t>::size((string<wchar_t> *)0x3c1a4e);
          local_b9 = 0;
          local_1a5 = false;
          if (uVar6 <= uVar5) {
            core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                      (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
            core::string<wchar_t>::size((string<wchar_t> *)0x3c1aab);
            core::string<wchar_t>::subString
                      ((string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                       SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
            local_b9 = 1;
            local_1a5 = core::string<wchar_t>::equals_ignore_case
                                  ((string<wchar_t> *)
                                   CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                                   in_stack_fffffffffffffe10);
          }
          in_stack_fffffffffffffe3c = CONCAT13(local_1a5,(int3)in_stack_fffffffffffffe3c);
          if ((local_b9 & 1) != 0) {
            core::string<wchar_t>::~string((string<wchar_t> *)0x3c1b04);
          }
          local_c0 = local_98;
          if ((in_stack_fffffffffffffe3c & 0x1000000) != 0) {
            return true;
          }
        }
        do {
          do {
            local_c0 = local_c0 + 1;
            iVar4 = local_c0;
            uVar5 = core::array<irr::gui::CGUIListBox::ListItem>::size
                              ((array<irr::gui::CGUIListBox::ListItem> *)0x3c1b4d);
            if ((int)uVar5 <= iVar4) {
              local_c0 = 0;
              do {
                if (local_98 < local_c0) {
                  return true;
                }
                core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                          (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
                uVar5 = core::string<wchar_t>::size((string<wchar_t> *)0x3c1d3d);
                uVar6 = core::string<wchar_t>::size((string<wchar_t> *)0x3c1d55);
                if (uVar6 <= uVar5) {
                  other = (string<wchar_t> *)(in_RDI + 0x32);
                  core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
                  core::string<wchar_t>::size((string<wchar_t> *)0x3c1da5);
                  core::string<wchar_t>::subString
                            ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffe3c,iVar4),
                             in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                             SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
                  bVar3 = core::string<wchar_t>::equals_ignore_case
                                    ((string<wchar_t> *)CONCAT44(uVar5,in_stack_fffffffffffffe18),
                                     other);
                  in_stack_fffffffffffffe18 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe18);
                  core::string<wchar_t>::~string((string<wchar_t> *)0x3c1de2);
                  if ((in_stack_fffffffffffffe18 & 0x1000000) != 0) {
                    if ((((in_RDI[4] != 0) && ((int)in_RDI[0x2b] != local_c0)) &&
                        ((*(byte *)(in_RDI + 0x36) & 1) == 0)) &&
                       ((*(byte *)((long)in_RDI + 0x1b2) & 1) == 0)) {
                      *(int *)(in_RDI + 0x2b) = local_c0;
                      local_170[0] = 0;
                      local_160 = 0;
                      local_158 = 9;
                      (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],local_170);
                    }
                    (**(code **)(*in_RDI + 0x170))(in_RDI,local_c0);
                    return true;
                  }
                }
                local_c0 = local_c0 + 1;
              } while( true );
            }
            core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                      (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
            in_stack_fffffffffffffe34 = core::string<wchar_t>::size((string<wchar_t> *)0x3c1b7e);
            uVar5 = core::string<wchar_t>::size((string<wchar_t> *)0x3c1b96);
          } while (in_stack_fffffffffffffe34 < uVar5);
          in_stack_fffffffffffffe28 = in_RDI + 0x32;
          core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                    (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
          core::string<wchar_t>::size((string<wchar_t> *)0x3c1be6);
          core::string<wchar_t>::subString
                    ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffe3c,iVar4),
                     in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                     SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
          bVar3 = core::string<wchar_t>::equals_ignore_case
                            ((string<wchar_t> *)
                             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                             in_stack_fffffffffffffe10);
          in_stack_fffffffffffffe30 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe30);
          core::string<wchar_t>::~string((string<wchar_t> *)0x3c1c23);
        } while ((in_stack_fffffffffffffe30 & 0x1000000) == 0);
        if (((in_RDI[4] != 0) && ((int)in_RDI[0x2b] != local_c0)) &&
           (((*(byte *)(in_RDI + 0x36) & 1) == 0 && ((*(byte *)((long)in_RDI + 0x1b2) & 1) == 0))))
        {
          local_118[0] = 0;
          local_108 = 0;
          local_100 = 9;
          (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],local_118);
        }
        (**(code **)(*in_RDI + 0x170))(in_RDI,local_c0);
        return true;
      }
    }
  }
  bVar3 = IGUIElement::OnEvent
                    ((IGUIElement *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdf8);
  return bVar3;
}

Assistant:

bool CGUIListBox::OnEvent(const SEvent &event)
{
	if (isEnabled()) {
		switch (event.EventType) {
		case EET_KEY_INPUT_EVENT:
			if (event.KeyInput.PressedDown &&
					(event.KeyInput.Key == KEY_DOWN ||
							event.KeyInput.Key == KEY_UP ||
							event.KeyInput.Key == KEY_HOME ||
							event.KeyInput.Key == KEY_END ||
							event.KeyInput.Key == KEY_NEXT ||
							event.KeyInput.Key == KEY_PRIOR)) {
				s32 oldSelected = Selected;
				switch (event.KeyInput.Key) {
				case KEY_DOWN:
					Selected += 1;
					break;
				case KEY_UP:
					Selected -= 1;
					break;
				case KEY_HOME:
					Selected = 0;
					break;
				case KEY_END:
					Selected = (s32)Items.size() - 1;
					break;
				case KEY_NEXT:
					Selected += AbsoluteRect.getHeight() / ItemHeight;
					break;
				case KEY_PRIOR:
					Selected -= AbsoluteRect.getHeight() / ItemHeight;
					break;
				default:
					break;
				}
				if (Selected < 0)
					Selected = 0;
				if (Selected >= (s32)Items.size())
					Selected = Items.size() - 1; // will set Selected to -1 for empty listboxes which is correct

				recalculateScrollPos();

				// post the news

				if (oldSelected != Selected && Parent && !Selecting && !MoveOverSelect) {
					SEvent e;
					e.EventType = EET_GUI_EVENT;
					e.GUIEvent.Caller = this;
					e.GUIEvent.Element = 0;
					e.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
					Parent->OnEvent(e);
				}

				return true;
			} else if (!event.KeyInput.PressedDown && (event.KeyInput.Key == KEY_RETURN || event.KeyInput.Key == KEY_SPACE)) {
				if (Parent) {
					SEvent e;
					e.EventType = EET_GUI_EVENT;
					e.GUIEvent.Caller = this;
					e.GUIEvent.Element = 0;
					e.GUIEvent.EventType = EGET_LISTBOX_SELECTED_AGAIN;
					Parent->OnEvent(e);
				}
				return true;
			} else if (event.KeyInput.Key == KEY_TAB) {
				return false;
			} else if (event.KeyInput.PressedDown && event.KeyInput.Char) {
				// change selection based on text as it is typed.
				u32 now = os::Timer::getTime();

				if (now - LastKeyTime < 500) {
					// add to key buffer if it isn't a key repeat
					if (!(KeyBuffer.size() == 1 && KeyBuffer[0] == event.KeyInput.Char)) {
						KeyBuffer += L" ";
						KeyBuffer[KeyBuffer.size() - 1] = event.KeyInput.Char;
					}
				} else {
					KeyBuffer = L" ";
					KeyBuffer[0] = event.KeyInput.Char;
				}
				LastKeyTime = now;

				// find the selected item, starting at the current selection
				s32 start = Selected;
				// dont change selection if the key buffer matches the current item
				if (Selected > -1 && KeyBuffer.size() > 1) {
					if (Items[Selected].Text.size() >= KeyBuffer.size() &&
							KeyBuffer.equals_ignore_case(Items[Selected].Text.subString(0, KeyBuffer.size())))
						return true;
				}

				s32 current;
				for (current = start + 1; current < (s32)Items.size(); ++current) {
					if (Items[current].Text.size() >= KeyBuffer.size()) {
						if (KeyBuffer.equals_ignore_case(Items[current].Text.subString(0, KeyBuffer.size()))) {
							if (Parent && Selected != current && !Selecting && !MoveOverSelect) {
								SEvent e;
								e.EventType = EET_GUI_EVENT;
								e.GUIEvent.Caller = this;
								e.GUIEvent.Element = 0;
								e.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
								Parent->OnEvent(e);
							}
							setSelected(current);
							return true;
						}
					}
				}
				for (current = 0; current <= start; ++current) {
					if (Items[current].Text.size() >= KeyBuffer.size()) {
						if (KeyBuffer.equals_ignore_case(Items[current].Text.subString(0, KeyBuffer.size()))) {
							if (Parent && Selected != current && !Selecting && !MoveOverSelect) {
								Selected = current;
								SEvent e;
								e.EventType = EET_GUI_EVENT;
								e.GUIEvent.Caller = this;
								e.GUIEvent.Element = 0;
								e.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
								Parent->OnEvent(e);
							}
							setSelected(current);
							return true;
						}
					}
				}

				return true;
			}
			break;

		case EET_GUI_EVENT:
			switch (event.GUIEvent.EventType) {
			case gui::EGET_SCROLL_BAR_CHANGED:
				if (event.GUIEvent.Caller == ScrollBar)
					return true;
				break;
			case gui::EGET_ELEMENT_FOCUS_LOST: {
				if (event.GUIEvent.Caller == this)
					Selecting = false;
			}
			default:
				break;
			}
			break;

		case EET_MOUSE_INPUT_EVENT: {
			core::position2d<s32> p(event.MouseInput.X, event.MouseInput.Y);

			switch (event.MouseInput.Event) {
			case EMIE_MOUSE_WHEEL:
				ScrollBar->setPos(ScrollBar->getPos() + (event.MouseInput.Wheel < 0 ? -1 : 1) * -ItemHeight / 2);
				return true;

			case EMIE_LMOUSE_PRESSED_DOWN: {
				Selecting = true;
				return true;
			}

			case EMIE_LMOUSE_LEFT_UP: {
				Selecting = false;

				if (isPointInside(p))
					selectNew(event.MouseInput.Y);

				return true;
			}

			case EMIE_MOUSE_MOVED:
				if (Selecting || MoveOverSelect) {
					if (isPointInside(p)) {
						selectNew(event.MouseInput.Y, true);
						return true;
					}
				}
			default:
				break;
			}
		} break;
		default:
			break;
		}
	}

	return IGUIElement::OnEvent(event);
}